

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_vcipher_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  long lVar1;
  long lVar2;
  uint64_t local_38;
  uint64_t uStack_30;
  ppc_avr_t result;
  
  lVar2 = 0;
  for (lVar1 = 3; -1 < lVar1; lVar1 = lVar1 + -1) {
    *(uint32_t *)((long)&local_38 + lVar2) =
         AES_Te0[a->u8[0xf - (ulong)""[lVar1 * 4]]] ^ *(uint *)((long)b + lVar2) ^
         AES_Te1[a->u8[0xf - (ulong)""[lVar1 * 4 + 1]]] ^
         AES_Te2[a->u8[0xf - (ulong)""[lVar1 * 4 + 2]]] ^
         AES_Te3[a->u8[0xf - (ulong)""[lVar1 * 4 + 3]]];
    lVar2 = lVar2 + 4;
  }
  r->u64[0] = local_38;
  r->u64[1] = uStack_30;
  return;
}

Assistant:

void helper_vcipher(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    ppc_avr_t result;
    int i;

    VECTOR_FOR_INORDER_I(i, u32) {
        result.VsrW(i) = b->VsrW(i) ^
            (AES_Te0[a->VsrB(AES_shifts[4 * i + 0])] ^
             AES_Te1[a->VsrB(AES_shifts[4 * i + 1])] ^
             AES_Te2[a->VsrB(AES_shifts[4 * i + 2])] ^
             AES_Te3[a->VsrB(AES_shifts[4 * i + 3])]);
    }
    *r = result;
}